

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O1

void __thiscall
crypto_tests::CryptoTest::
TestVector<CRIPEMD160,std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (CryptoTest *this,CRIPEMD160 *h,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *out)

{
  pointer puVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  CRIPEMD160 *pCVar5;
  uint64_t len;
  long lVar6;
  uint64_t maxval;
  ulong uVar7;
  undefined8 *puVar8;
  CRIPEMD160 *pCVar9;
  iterator in_R8;
  iterator pvVar10;
  iterator in_R9;
  iterator pvVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  byte bVar14;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hash;
  CRIPEMD160 hasher;
  check_type cVar15;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  assertion_result local_1b0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  undefined1 local_f8 [8];
  element_type *local_f0;
  shared_count sStack_e8;
  char **local_e0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  char **local_80;
  long local_38;
  
  bVar14 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x25;
  file.m_begin = (iterator)&local_128;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_138,msg);
  local_f8[0] = (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start == 0x14;
  local_f0 = (element_type *)0x0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "out.size() == h.OUTPUT_SIZE";
  local_1b0.m_message.px = (element_type *)0xe7e231;
  local_98[8] = false;
  local_98._0_8_ = &PTR__lazy_ostream_013abc70;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_140 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_80 = (char **)&local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f8,(lazy_ostream *)local_98,1,0,WARN,_cVar15,
             (size_t)&local_148,0x25);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&local_118,
             (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start);
  pCVar5 = h;
  pCVar9 = (CRIPEMD160 *)local_98;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    *(undefined8 *)pCVar9->s = *(undefined8 *)pCVar5->s;
    pCVar5 = (CRIPEMD160 *)((long)pCVar5 + (ulong)bVar14 * -0x10 + 8);
    pCVar9 = (CRIPEMD160 *)((long)pCVar9 + (ulong)bVar14 * -0x10 + 8);
  }
  pCVar5 = CRIPEMD160::Write((CRIPEMD160 *)local_98,(uchar *)(in->_M_dataplus)._M_p,
                             in->_M_string_length);
  CRIPEMD160::Finalize
            (pCVar5,local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x2a;
  file_00.m_begin = (iterator)&local_158;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_168,
             msg_00);
  puVar1 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1) {
    if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar13 = true;
    }
    else {
      iVar2 = bcmp(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,puVar1,
                   (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      bVar13 = iVar2 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  local_f8[0] = bVar13;
  local_f0 = (element_type *)0x0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "hash == out";
  local_1b0.m_message.px = (element_type *)0xf92d81;
  local_98[8] = false;
  local_98._0_8_ = &PTR__lazy_ostream_013abc70;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_170 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_80 = (char **)&local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f8,(lazy_ostream *)local_98,1,0,WARN,_cVar15,
             (size_t)&local_178,0x2a);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  iVar2 = 0;
  do {
    pCVar5 = h;
    puVar8 = (undefined8 *)local_98;
    for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar8 = *(undefined8 *)pCVar5->s;
      pCVar5 = (CRIPEMD160 *)((long)pCVar5 + (ulong)bVar14 * -0x10 + 8);
      puVar8 = puVar8 + (ulong)bVar14 * -2 + 1;
    }
    uVar7 = in->_M_string_length;
    if (uVar7 != 0) {
      uVar12 = 0;
      do {
        uVar7 = (uVar7 - uVar12) + 1 >> 1;
        if (uVar7 == 0) {
          uVar3 = 0x40;
        }
        else {
          lVar6 = 0x3f;
          if (uVar7 != 0) {
            for (; uVar7 >> lVar6 == 0; lVar6 = lVar6 + -1) {
            }
          }
          uVar3 = (uint)lVar6 ^ 0x3f;
        }
        do {
          len = RandomMixin<FastRandomContext>::randbits
                          (&(this->super_BasicTestingSetup).m_rng.
                            super_RandomMixin<FastRandomContext>,0x40 - uVar3);
        } while (uVar7 < len);
        CRIPEMD160::Write((CRIPEMD160 *)local_98,(uchar *)((in->_M_dataplus)._M_p + uVar12),len);
        uVar12 = len + uVar12;
        if (uVar12 != 0) {
          uVar7 = in->_M_string_length;
          if ((uVar12 <= uVar7 && uVar7 - uVar12 != 0) &&
             (uVar7 < uVar12 + ((long)(out->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(out->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_start) * 2)) {
            puVar8 = (undefined8 *)local_98;
            pCVar5 = (CRIPEMD160 *)local_f8;
            for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
              *(undefined8 *)pCVar5->s = *puVar8;
              puVar8 = puVar8 + (ulong)bVar14 * -2 + 1;
              pCVar5 = (CRIPEMD160 *)((long)pCVar5 + (ulong)bVar14 * -0x10 + 8);
            }
            pCVar5 = CRIPEMD160::Write((CRIPEMD160 *)local_f8,
                                       (uchar *)((in->_M_dataplus)._M_p + uVar12),uVar7 - uVar12);
            CRIPEMD160::Finalize
                      (pCVar5,local_118.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            local_188 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
            ;
            local_180 = "";
            local_198 = &boost::unit_test::basic_cstring<char_const>::null;
            local_190 = &boost::unit_test::basic_cstring<char_const>::null;
            file_01.m_end = (iterator)0x37;
            file_01.m_begin = (iterator)&local_188;
            msg_01.m_end = pvVar11;
            msg_01.m_begin = pvVar10;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                       (size_t)&local_198,msg_01);
            puVar1 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) {
              if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                bVar13 = true;
              }
              else {
                iVar4 = bcmp(local_118.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,puVar1,
                             (long)local_118.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_118.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                bVar13 = iVar4 == 0;
              }
            }
            else {
              bVar13 = false;
            }
            local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(readonly_property<bool>)bVar13;
            local_1b0.m_message.px = (element_type *)0x0;
            local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_1c0 = "hash == out";
            local_1b8 = "";
            local_f0 = (element_type *)((ulong)local_f0 & 0xffffffffffffff00);
            local_f8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
            sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_e0 = &local_1c0;
            local_1d0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
            ;
            local_1c8 = "";
            pvVar10 = (iterator)0x1;
            pvVar11 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (&local_1b0,(lazy_ostream *)local_f8,1,0,WARN,_cVar15,(size_t)&local_1d0,0x37)
            ;
            boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
          }
        }
        uVar7 = in->_M_string_length;
      } while (uVar12 < uVar7);
    }
    CRIPEMD160::Finalize
              ((CRIPEMD160 *)local_98,
               local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    local_1e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_1d8 = "";
    local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x3b;
    file_02.m_begin = (iterator)&local_1e0;
    msg_02.m_end = pvVar11;
    msg_02.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1f0,
               msg_02);
    puVar1 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start ==
        (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar1) {
      if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        bVar13 = true;
      }
      else {
        iVar4 = bcmp(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,puVar1,
                     (long)local_118.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_118.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
        bVar13 = iVar4 == 0;
      }
    }
    else {
      bVar13 = false;
    }
    local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar13;
    local_1b0.m_message.px = (element_type *)0x0;
    local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1c0 = "hash == out";
    local_1b8 = "";
    local_f0 = (element_type *)((ulong)local_f0 & 0xffffffffffffff00);
    local_f8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
    sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_e0 = &local_1c0;
    local_200 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_1f8 = "";
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1b0,(lazy_ostream *)local_f8,1,0,WARN,_cVar15,(size_t)&local_200,0x3b);
    boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0x20);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TestVector(const Hasher &h, const In &in, const Out &out) {
    Out hash;
    BOOST_CHECK(out.size() == h.OUTPUT_SIZE);
    hash.resize(out.size());
    {
        // Test that writing the whole input string at once works.
        Hasher(h).Write((const uint8_t*)in.data(), in.size()).Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
    for (int i=0; i<32; i++) {
        // Test that writing the string broken up in random pieces works.
        Hasher hasher(h);
        size_t pos = 0;
        while (pos < in.size()) {
            size_t len = m_rng.randrange((in.size() - pos + 1) / 2 + 1);
            hasher.Write((const uint8_t*)in.data() + pos, len);
            pos += len;
            if (pos > 0 && pos + 2 * out.size() > in.size() && pos < in.size()) {
                // Test that writing the rest at once to a copy of a hasher works.
                Hasher(hasher).Write((const uint8_t*)in.data() + pos, in.size() - pos).Finalize(hash.data());
                BOOST_CHECK(hash == out);
            }
        }
        hasher.Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
}